

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::RadioEntityType::Encode(RadioEntityType *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8EntityKind);
  KDataStream::Write(stream,this->m_ui8Domain);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Country);
  KDataStream::Write(stream,this->m_ui8Category);
  KDataStream::Write(stream,this->m_ui8NomenclatureVersion);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Nomenclature);
  return;
}

Assistant:

void RadioEntityType::Encode( KDataStream & stream ) const
{
    stream << m_ui8EntityKind
           << m_ui8Domain
           << m_ui16Country
           << m_ui8Category
           << m_ui8NomenclatureVersion
           << m_ui16Nomenclature;
}